

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void dump_hex_script(envy_bios *bios,FILE *out,uint start,uint length)

{
  uint local_2c;
  uint local_28;
  uint len;
  uint i;
  int cnt;
  uint length_local;
  uint start_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  len = 0;
  i = length;
  cnt = start;
  while (i != 0) {
    local_2c = i;
    if (0x10 < i) {
      local_2c = 0x10;
    }
    if (len == 0) {
      fprintf((FILE *)out,"%04x:",(ulong)(uint)cnt);
    }
    else {
      fprintf((FILE *)out,"     ");
    }
    for (local_28 = 0; local_28 < local_2c; local_28 = local_28 + 1) {
      fprintf((FILE *)out," %02x",(ulong)bios->data[cnt + local_28]);
    }
    cnt = local_2c + cnt;
    i = i - local_2c;
    if (i == 0) {
      for (; local_2c < 0x10; local_2c = local_2c + 1) {
        fprintf((FILE *)out,"   ");
      }
      fprintf((FILE *)out,"  ");
    }
    else {
      fprintf((FILE *)out,"\n");
    }
    len = len + 1;
  }
  return;
}

Assistant:

void dump_hex_script (struct envy_bios *bios, FILE *out, unsigned int start, unsigned int length) {
	int cnt = 0;
	while (length) {
		unsigned int i, len = length;
		if (len > 16) len = 16;
		if (cnt)
			fprintf (out, "     ");
		else
			fprintf (out, "%04x:", start);
		for (i = 0; i < len; i++)
			fprintf(out, " %02x", bios->data[start+i]);
		start += len;
		length -= len;
		if (length) {
			fprintf(out, "\n");
		} else {
			while (len < 16) {
				fprintf(out, "   ");
				len++;
			}
			fprintf(out, "  ");
		}
		cnt++;
	}
}